

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_map.cpp
# Opt level: O0

bool P_BounceActor(AActor *mo,AActor *BlockingMobj,bool ontop)

{
  double *pdVar1;
  double dVar2;
  AActor *this;
  unsigned_short uVar3;
  uint uVar4;
  int iVar5;
  ActorBounceFlags *pAVar6;
  FState *newstate;
  bool bVar7;
  double dVar8;
  Self local_be;
  TFlags<ActorFlag,_unsigned_int> local_bc;
  undefined1 local_b6 [2];
  TFlags<ActorBounceFlag,_unsigned_short> local_b4;
  TFlags<ActorBounceFlag,_unsigned_short> local_b2;
  Self local_b0;
  FName local_ac;
  TFlags<ActorBounceFlag,_unsigned_short> local_a6;
  undefined1 local_a4 [2];
  TFlags<ActorBounceFlag,_unsigned_short> local_a2;
  double local_a0;
  double dot;
  TFlags<ActorFlag,_unsigned_int> local_90;
  int local_8c;
  FState *pFStack_88;
  int count;
  FState *bouncestate;
  FName names [3];
  double speed;
  TAngle<double> local_60;
  DAngle angle;
  TFlags<ActorFlag7,_unsigned_int> local_50;
  TFlags<ActorFlag3,_unsigned_int> local_4c;
  TFlags<ActorFlag2,_unsigned_int> local_48;
  TFlags<ActorFlag2,_unsigned_int> local_44;
  TFlags<ActorFlag6,_unsigned_int> local_40;
  TFlags<ActorFlag5,_unsigned_int> local_3c;
  TFlags<ActorFlag2,_unsigned_int> local_38;
  TFlags<ActorFlag,_unsigned_int> local_34;
  TFlags<ActorBounceFlag,_unsigned_short> local_2e;
  TFlags<ActorFlag7,_unsigned_int> local_2c;
  TFlags<ActorFlag2,_unsigned_int> local_28;
  byte local_21;
  AActor *pAStack_20;
  bool ontop_local;
  AActor *BlockingMobj_local;
  AActor *mo_local;
  
  bVar7 = false;
  local_21 = ontop;
  pAStack_20 = BlockingMobj;
  BlockingMobj_local = mo;
  if (BlockingMobj != (AActor *)0x0) {
    TFlags<ActorFlag2,_unsigned_int>::operator&
              (&local_28,(int)BlockingMobj + (MF2_RIP|MF2_NOTELEPORT|MF2_FLY));
    uVar4 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_28);
    bVar7 = false;
    if (uVar4 != 0) {
      TFlags<ActorFlag7,_unsigned_int>::operator&
                (&local_2c,
                 (int)pAStack_20 +
                 (MF7_DONTTHRUST|MF7_FOILBUDDHA|MF7_HARMFRIENDS|MF7_ALWAYSTELEFRAG));
      uVar4 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_2c);
      bVar7 = uVar4 != 0;
    }
  }
  if (bVar7) {
    return true;
  }
  bVar7 = false;
  if ((BlockingMobj_local == (AActor *)0x0) || (bVar7 = false, pAStack_20 == (AActor *)0x0))
  goto LAB_0067729c;
  TFlags<ActorBounceFlag,_unsigned_short>::operator&
            (&local_2e,
             (int)BlockingMobj_local +
             (BOUNCE_Quiet|BOUNCE_UseSeeSound|BOUNCE_AutoOff|BOUNCE_Actors));
  uVar3 = TFlags::operator_cast_to_unsigned_short((TFlags *)&local_2e);
  bVar7 = true;
  if (uVar3 != 0) goto LAB_0067729c;
  TFlags<ActorFlag,_unsigned_int>::operator&
            (&local_34,
             (int)BlockingMobj_local + (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_NOSECTOR|MF_SHOOTABLE));
  uVar4 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_34);
  if (uVar4 == 0) goto LAB_0067723e;
  TFlags<ActorFlag2,_unsigned_int>::operator&
            (&local_38,(int)BlockingMobj_local + (MF2_RIP|MF2_NOTELEPORT|MF2_FLY));
  uVar4 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_38);
  if (uVar4 == 0) {
LAB_0067720d:
    TFlags<ActorFlag2,_unsigned_int>::operator&
              (&local_48,(int)pAStack_20 + (MF2_RIP|MF2_NOTELEPORT|MF2_FLY));
    uVar4 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_48);
    bVar7 = true;
    if (uVar4 != 0) goto LAB_0067729c;
  }
  else {
    TFlags<ActorFlag5,_unsigned_int>::operator&
              (&local_3c,
               (int)pAStack_20 +
               (MF5_BLOODSPLATTER|MF5_CHASEGOAL|MF5_COUNTSECRET|MF5_NOFORWARDFALL|MF5_NODROPOFF));
    uVar4 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_3c);
    if (uVar4 != 0) goto LAB_0067720d;
    TFlags<ActorFlag6,_unsigned_int>::operator&
              (&local_40,(int)BlockingMobj_local + (MF6_NOTELEFRAG|MF6_STEPMISSILE|MF6_BUMPSPECIAL))
    ;
    uVar4 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_40);
    if (uVar4 != 0) {
      TFlags<ActorFlag2,_unsigned_int>::operator&
                (&local_44,(int)pAStack_20 + (MF2_RIP|MF2_NOTELEPORT|MF2_FLY));
      uVar4 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_44);
      if (uVar4 != 0) goto LAB_0067720d;
    }
  }
LAB_0067723e:
  bVar7 = false;
  if (pAStack_20->player == (player_t *)0x0) {
    TFlags<ActorFlag3,_unsigned_int>::operator&
              (&local_4c,
               (int)pAStack_20 + (MF3_DONTOVERLAP|MF3_NOSIGHTCHECK|MF3_ALWAYSPUFF|MF3_NORADIUSDMG));
    uVar4 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_4c);
    bVar7 = uVar4 == 0;
  }
LAB_0067729c:
  if (bVar7) {
    if ((BlockingMobj_local->bouncecount < 1) ||
       (iVar5 = BlockingMobj_local->bouncecount + -1, BlockingMobj_local->bouncecount = iVar5,
       iVar5 != 0)) {
      TFlags<ActorFlag7,_unsigned_int>::operator&
                (&local_50,
                 (int)BlockingMobj_local +
                 (MF7_DONTTHRUST|MF7_FOILBUDDHA|MF7_HARMFRIENDS|MF7_ALWAYSTELEFRAG));
      uVar4 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_50);
      if (uVar4 != 0) {
        TObjPtr<AActor>::operator=(&BlockingMobj_local->target,pAStack_20);
      }
      TFlags<ActorFlag7,_unsigned_int>::operator&
                ((TFlags<ActorFlag7,_unsigned_int> *)((long)&angle.Degrees + 4),
                 (int)BlockingMobj_local +
                 (MF7_DONTTHRUST|MF7_FOILBUDDHA|MF7_HARMFRIENDS|MF7_ALWAYSTELEFRAG));
      uVar4 = TFlags::operator_cast_to_unsigned_int((TFlags *)((long)&angle.Degrees + 4));
      if (uVar4 != 0) {
        TObjPtr<AActor>::operator=(&BlockingMobj_local->master,pAStack_20);
      }
      TFlags<ActorFlag7,_unsigned_int>::operator&
                ((TFlags<ActorFlag7,_unsigned_int> *)&angle,
                 (int)BlockingMobj_local +
                 (MF7_DONTTHRUST|MF7_FOILBUDDHA|MF7_HARMFRIENDS|MF7_ALWAYSTELEFRAG));
      uVar4 = TFlags::operator_cast_to_unsigned_int((TFlags *)&angle);
      if (uVar4 != 0) {
        TObjPtr<AActor>::operator=(&BlockingMobj_local->tracer,pAStack_20);
      }
      if ((local_21 & 1) == 0) {
        AActor::AngleTo((AActor *)&speed,pAStack_20,SUB81(BlockingMobj_local,0));
        iVar5 = FRandom::operator()(&pr_bounce);
        TAngle<double>::operator+(&local_60,(double)(iVar5 % 0x10 + -8));
        register0x00001200 = AActor::VelXYToSpeed(BlockingMobj_local);
        register0x00001200 = register0x00001200 * BlockingMobj_local->wallbouncefactor;
        TAngle<double>::operator=(&(BlockingMobj_local->Angles).Yaw,&local_60);
        AActor::VelFromAngle(BlockingMobj_local,stack0xffffffffffffff90);
        AActor::PlayBounceSound(BlockingMobj_local,true);
        TFlags<ActorBounceFlag,_unsigned_short>::operator&
                  ((TFlags<ActorBounceFlag,_unsigned_short> *)((long)&names[1].Index + 2),
                   (int)BlockingMobj_local +
                   (BOUNCE_Quiet|BOUNCE_UseSeeSound|BOUNCE_AutoOff|BOUNCE_Actors));
        uVar3 = TFlags::operator_cast_to_unsigned_short((TFlags *)((long)&names[1].Index + 2));
        if (uVar3 != 0) {
          FName::FName((FName *)&bouncestate,NAME_Bounce);
          FName::FName((FName *)((long)&bouncestate + 4),NAME_Actor);
          FName::FName(names,NAME_Creature);
          local_8c = 2;
          TFlags<ActorFlag,_unsigned_int>::operator&
                    (&local_90,
                     (int)pAStack_20 + (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_NOSECTOR|MF_SHOOTABLE));
          uVar4 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_90);
          bVar7 = false;
          if (uVar4 != 0) {
            TFlags<ActorFlag,_unsigned_int>::operator&
                      ((TFlags<ActorFlag,_unsigned_int> *)((long)&dot + 4),
                       (int)pAStack_20 + (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_NOSECTOR|MF_SHOOTABLE))
            ;
            uVar4 = TFlags::operator_cast_to_unsigned_int((TFlags *)((long)&dot + 4));
            bVar7 = uVar4 == 0;
          }
          if (bVar7) {
            local_8c = 3;
          }
          pFStack_88 = AActor::FindState(BlockingMobj_local,local_8c,(FName *)&bouncestate,false);
          if (pFStack_88 != (FState *)0x0) {
            AActor::SetState(BlockingMobj_local,pFStack_88,false);
          }
        }
      }
      else {
        local_a0 = (BlockingMobj_local->Vel).Z;
        pAVar6 = &BlockingMobj_local->BounceFlags;
        operator|((EnumType)local_a4,BOUNCE_HereticType);
        TFlags<ActorBounceFlag,_unsigned_short>::operator&(&local_a2,pAVar6);
        uVar3 = TFlags::operator_cast_to_unsigned_short((TFlags *)&local_a2);
        if (uVar3 == 0) {
          (BlockingMobj_local->Vel).Z =
               ((BlockingMobj_local->Vel).Z - 2.0 / local_a0) * BlockingMobj_local->bouncefactor;
        }
        else {
          (BlockingMobj_local->Vel).Z = (BlockingMobj_local->Vel).Z - 2.0 / local_a0;
          TFlags<ActorBounceFlag,_unsigned_short>::operator&
                    (&local_a6,
                     (int)BlockingMobj_local +
                     (BOUNCE_Quiet|BOUNCE_UseSeeSound|BOUNCE_AutoOff|BOUNCE_Actors));
          uVar3 = TFlags::operator_cast_to_unsigned_short((TFlags *)&local_a6);
          if (uVar3 == 0) {
            TFlags<ActorFlag,_unsigned_int>::operator|=(&BlockingMobj_local->flags,MF_INBOUNCE);
            this = BlockingMobj_local;
            FName::FName(&local_ac,NAME_Death);
            newstate = AActor::FindState(this,&local_ac);
            AActor::SetState(this,newstate,false);
            operator~((EnumType)&local_b0);
            TFlags<ActorFlag,_unsigned_int>::operator&=(&BlockingMobj_local->flags,&local_b0);
            return false;
          }
          (BlockingMobj_local->Vel).Z =
               BlockingMobj_local->bouncefactor * (BlockingMobj_local->Vel).Z;
        }
        AActor::PlayBounceSound(BlockingMobj_local,true);
        TFlags<ActorBounceFlag,_unsigned_short>::operator&
                  (&local_b2,
                   (int)BlockingMobj_local +
                   (BOUNCE_Quiet|BOUNCE_UseSeeSound|BOUNCE_AutoOff|BOUNCE_Actors));
        uVar3 = TFlags::operator_cast_to_unsigned_short((TFlags *)&local_b2);
        if (uVar3 == 0) {
          pAVar6 = &BlockingMobj_local->BounceFlags;
          operator|((EnumType)local_b6,BOUNCE_AutoOff);
          TFlags<ActorBounceFlag,_unsigned_short>::operator&(&local_b4,pAVar6);
          uVar3 = TFlags::operator_cast_to_unsigned_short((TFlags *)&local_b4);
          if (uVar3 != 0) {
            TFlags<ActorFlag,_unsigned_int>::operator&
                      (&local_bc,
                       (int)BlockingMobj_local +
                       (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_NOSECTOR|MF_SHOOTABLE));
            uVar4 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_bc);
            bVar7 = false;
            if (uVar4 == 0) {
              pdVar1 = &(BlockingMobj_local->Vel).Z;
              bVar7 = *pdVar1 <= 3.0 && *pdVar1 != 3.0;
            }
            if (bVar7) {
              operator~((EnumType)&local_be);
              TFlags<ActorBounceFlag,_unsigned_short>::operator&=
                        (&BlockingMobj_local->BounceFlags,&local_be);
            }
          }
        }
        else {
          dVar2 = (BlockingMobj_local->Vel).Z;
          iVar5 = BlockingMobj_local->Mass;
          dVar8 = AActor::GetGravity(BlockingMobj_local);
          if (ABS(dVar2) < ((double)iVar5 * dVar8) / 64.0) {
            (BlockingMobj_local->Vel).Z = 0.0;
          }
        }
      }
      mo_local._7_1_ = true;
    }
    else {
      mo_local._7_1_ = false;
    }
  }
  else {
    mo_local._7_1_ = false;
  }
  return mo_local._7_1_;
}

Assistant:

bool P_BounceActor(AActor *mo, AActor *BlockingMobj, bool ontop)
{
	//Don't go through all of this if the actor is reflective and wants things to pass through them.
	if (BlockingMobj && ((BlockingMobj->flags2 & MF2_REFLECTIVE) && (BlockingMobj->flags7 & MF7_THRUREFLECT))) return true;
	if (mo && BlockingMobj && ((mo->BounceFlags & BOUNCE_AllActors)
		|| ((mo->flags & MF_MISSILE) && (!(mo->flags2 & MF2_RIP) 
		|| (BlockingMobj->flags5 & MF5_DONTRIP) 
		|| ((mo->flags6 & MF6_NOBOSSRIP) && (BlockingMobj->flags2 & MF2_BOSS))) && (BlockingMobj->flags2 & MF2_REFLECTIVE))
		|| ((BlockingMobj->player == NULL) && (!(BlockingMobj->flags3 & MF3_ISMONSTER)))))
	{
		if (mo->bouncecount > 0 && --mo->bouncecount == 0) return false;

		if (mo->flags7 & MF7_HITTARGET)	mo->target = BlockingMobj;
		if (mo->flags7 & MF7_HITMASTER)	mo->master = BlockingMobj;
		if (mo->flags7 & MF7_HITTRACER)	mo->tracer = BlockingMobj;

		if (!ontop)
		{
			DAngle angle = BlockingMobj->AngleTo(mo) + ((pr_bounce() % 16) - 8);
			double speed = mo->VelXYToSpeed() * mo->wallbouncefactor; // [GZ] was 0.75, using wallbouncefactor seems more consistent
			mo->Angles.Yaw = angle;
			mo->VelFromAngle(speed);
			mo->PlayBounceSound(true);
			if (mo->BounceFlags & BOUNCE_UseBounceState)
			{
				FName names[] = { NAME_Bounce, NAME_Actor, NAME_Creature };
				FState *bouncestate;
				int count = 2;

				if ((BlockingMobj->flags & MF_SHOOTABLE) && !(BlockingMobj->flags & MF_NOBLOOD))
				{
					count = 3;
				}
				bouncestate = mo->FindState(count, names);
				if (bouncestate != NULL)
				{
					mo->SetState(bouncestate);
				}
			}
		}
		else
		{
			double dot = mo->Vel.Z;

			if (mo->BounceFlags & (BOUNCE_HereticType | BOUNCE_MBF))
			{
				mo->Vel.Z -= 2. / dot;
				if (!(mo->BounceFlags & BOUNCE_MBF)) // Heretic projectiles die, MBF projectiles don't.
				{
					mo->flags |= MF_INBOUNCE;
					mo->SetState(mo->FindState(NAME_Death));
					mo->flags &= ~MF_INBOUNCE;
					return false;
				}
				else
				{
					mo->Vel.Z *= mo->bouncefactor;
				}
			}
			else // Don't run through this for MBF-style bounces
			{
				// The reflected velocity keeps only about 70% of its original speed
				mo->Vel.Z = (mo->Vel.Z - 2. / dot) * mo->bouncefactor;
			}

			mo->PlayBounceSound(true);
			if (mo->BounceFlags & BOUNCE_MBF) // Bring it to rest below a certain speed
			{
				if (fabs(mo->Vel.Z) < mo->Mass * mo->GetGravity() / 64)
					mo->Vel.Z = 0;
			}
			else if (mo->BounceFlags & (BOUNCE_AutoOff | BOUNCE_AutoOffFloorOnly))
			{
				if (!(mo->flags & MF_NOGRAVITY) && (mo->Vel.Z < 3.))
					mo->BounceFlags &= ~BOUNCE_TypeMask;
			}
		}
		return true;
	}
	return false;
}